

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

size_t bignParamsVal_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t m;
  size_t n_00;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t in_RSI;
  size_t in_RDI;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  
  sVar1 = beltHash_keep();
  sVar2 = beltHash_keep();
  m = ecpIsValid_deep(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  n_00 = ecpIsSafeGroup_deep(in_stack_ffffffffffffffc0);
  sVar3 = ecpIsOnA_deep(in_RDI,in_RSI);
  sVar4 = qrPower_deep(n_00,m,sVar2);
  sVar5 = ecHasOrderA_deep(n_00,m,sVar2,in_stack_ffffffffffffffa8);
  sVar2 = utilMax(6,sVar2,m,n_00,sVar3,sVar4,sVar5);
  return sVar1 + 0x40 + sVar2;
}

Assistant:

static size_t bignParamsVal_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return beltHash_keep() + O_OF_B(512) +
		utilMax(6,
			beltHash_keep(),
			ecpIsValid_deep(n, f_deep),
			ecpIsSafeGroup_deep(n),
			ecpIsOnA_deep(n, f_deep),
			qrPower_deep(n, n, f_deep),
			ecHasOrderA_deep(n, ec_d, ec_deep, n));
}